

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralResultGroup::~IfcStructuralResultGroup
          (IfcStructuralResultGroup *this)

{
  IfcStructuralResultGroup *this_local;
  
  ~IfcStructuralResultGroup(this);
  operator_delete(this);
  return;
}

Assistant:

IfcStructuralResultGroup() : Object("IfcStructuralResultGroup") {}